

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O1

int dwarf_formexprloc(Dwarf_Attribute attr,Dwarf_Unsigned *return_exprlen,Dwarf_Ptr *block_ptr,
                     Dwarf_Error *error)

{
  ushort uVar1;
  Dwarf_Small *pDVar2;
  Dwarf_Ptr *ppvVar3;
  int iVar4;
  Dwarf_Byte_Ptr pDVar5;
  char *pcVar6;
  Dwarf_Signed errval;
  Dwarf_Debug dbg_00;
  Dwarf_Debug dbg;
  Dwarf_Unsigned section_len;
  Dwarf_Unsigned lu_local;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Debug local_88;
  char *local_80;
  char *local_78;
  Dwarf_Small *local_70;
  Dwarf_Ptr *local_68;
  char *local_60;
  Dwarf_CU_Context_conflict local_58;
  dwarfstring_s local_50;
  
  local_88 = (Dwarf_Debug)0x0;
  local_58 = (Dwarf_CU_Context_conflict)0x0;
  iVar4 = get_attr_dbg(&local_88,&local_58,attr,error);
  if (iVar4 == 0) {
    uVar1 = attr->ar_attribute_form;
    if (uVar1 == 0x18) {
      local_80 = (char *)0x0;
      pDVar2 = attr->ar_debug_ptr;
      local_68 = block_ptr;
      pDVar5 = _dwarf_calculate_info_section_start_ptr(local_58,(Dwarf_Unsigned *)&local_80);
      local_50.s_data = (char *)0x0;
      local_60 = (char *)0x0;
      local_70 = pDVar2;
      iVar4 = dwarf_decode_leb128((char *)pDVar2,(Dwarf_Unsigned *)&local_50,
                                  (Dwarf_Unsigned *)&local_60,(char *)(pDVar5 + (long)local_80));
      pcVar6 = local_60;
      ppvVar3 = local_68;
      pDVar2 = local_70;
      if (iVar4 == 1) {
        _dwarf_error_string(local_88,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      if (local_80 < local_60) {
        dwarfstring_constructor(&local_50);
        dwarfstring_append_printf_u
                  (&local_50,"DW_DLE_ATTR_OUTSIDE_SECTION: The expression length is %u,",
                   (dwarfstring_u)pcVar6);
        dwarfstring_append_printf_u
                  (&local_50," but the section length is just %u. Corrupt Dwarf.",
                   (dwarfstring_u)local_80);
      }
      else {
        local_78 = local_50.s_data;
        iVar4 = _dwarf_reference_outside_section
                          (attr->ar_die,local_70,local_70 + (long)local_60 + (long)local_50.s_data);
        if (iVar4 == 0) {
          *return_exprlen = (Dwarf_Unsigned)pcVar6;
          *ppvVar3 = pDVar2 + (long)local_78;
          return 0;
        }
        dwarfstring_constructor(&local_50);
        dwarfstring_append_printf_u
                  (&local_50,"DW_DLE_ATTR_OUTSIDE_SECTION: The expression length %u,",
                   (dwarfstring_u)pcVar6);
        dwarfstring_append_printf_u
                  (&local_50," plus the leb value length of %u ",(dwarfstring_u)local_78);
        dwarfstring_append(&local_50," runs past the end of the section. Corrupt Dwarf.");
      }
      dbg_00 = local_88;
      pcVar6 = dwarfstring_string(&local_50);
      errval = 0x119;
    }
    else {
      local_80 = "<name not known>";
      dwarfstring_constructor(&local_50);
      dwarf_get_FORM_name((uint)uVar1,&local_80);
      dwarfstring_append_printf_u
                (&local_50,"DW_DLE_ATTR_EXPRLOC_FORM_BAD: The form is 0x%x ",(ulong)uVar1);
      dwarfstring_append_printf_s
                (&local_50,"(%s) but should be DW_FORM_exprloc. Corrupt Dwarf.",local_80);
      dbg_00 = local_88;
      pcVar6 = dwarfstring_string(&local_50);
      errval = 0xe0;
    }
    _dwarf_error_string(dbg_00,error,errval,pcVar6);
    dwarfstring_destructor(&local_50);
  }
  return 1;
}

Assistant:

int
dwarf_formexprloc(Dwarf_Attribute attr,
    Dwarf_Unsigned * return_exprlen,
    Dwarf_Ptr  * block_ptr,
    Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_CU_Context cu_context = 0;

    int res  = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    if (attr->ar_attribute_form == DW_FORM_exprloc ) {
        Dwarf_Die die = 0;
        Dwarf_Unsigned leb_len = 0;
        Dwarf_Byte_Ptr section_start = 0;
        Dwarf_Unsigned section_len = 0;
        Dwarf_Byte_Ptr section_end = 0;
        Dwarf_Byte_Ptr info_ptr = 0;
        Dwarf_Unsigned exprlen = 0;
        Dwarf_Small * addr = attr->ar_debug_ptr;

        info_ptr = addr;
        section_start =
            _dwarf_calculate_info_section_start_ptr(cu_context,
            &section_len);
        section_end = section_start + section_len;

        DECODE_LEB128_UWORD_LEN_CK(info_ptr, exprlen, leb_len,
            dbg,error,section_end);
        if (exprlen > section_len) {
            /* Corrupted dwarf!  */
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ATTR_OUTSIDE_SECTION: "
                "The expression length is %u,",exprlen);
            dwarfstring_append_printf_u(&m,
                " but the section length is just %u. "
                "Corrupt Dwarf.",section_len);
            _dwarf_error_string(dbg, error,
                DW_DLE_ATTR_OUTSIDE_SECTION,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        die = attr->ar_die;
        /*  Is the block entirely in the section, or is
            there bug somewhere?
            Here the final addr may be 1 past end of section. */
        if (_dwarf_reference_outside_section(die,
            (Dwarf_Small *)addr,
            ((Dwarf_Small *)addr)+exprlen +leb_len)) {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ATTR_OUTSIDE_SECTION: "
                "The expression length %u,",exprlen);
            dwarfstring_append_printf_u(&m,
                " plus the leb value length of "
                "%u ",leb_len);
            dwarfstring_append(&m,
                " runs past the end of the section. "
                "Corrupt Dwarf.");
            _dwarf_error_string(dbg, error,
                DW_DLE_ATTR_OUTSIDE_SECTION,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        *return_exprlen = exprlen;
        *block_ptr = addr + leb_len;
        return DW_DLV_OK;

    }
    {
        dwarfstring m;
        const char *name = "<name not known>";
        unsigned  mform = attr->ar_attribute_form;

        dwarfstring_constructor(&m);

        dwarf_get_FORM_name (mform,&name);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_ATTR_EXPRLOC_FORM_BAD: "
            "The form is 0x%x ", mform);
        dwarfstring_append_printf_s(&m,
            "(%s) but should be DW_FORM_exprloc. "
            "Corrupt Dwarf.",(char *)name);
        _dwarf_error_string(dbg, error, DW_DLE_ATTR_EXPRLOC_FORM_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
    }
    return DW_DLV_ERROR;
}